

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sticky.cpp
# Opt level: O0

void __thiscall OpenMD::Sticky::calcForce(Sticky *this,InteractionData *idat)

{
  vector<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
  *this_00;
  reference pvVar1;
  reference this_01;
  double *pdVar2;
  int *in_RSI;
  RealType *in_RDI;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Vector<double,_3U> *v;
  Vector<double,_3U> *v1;
  Vector<double,_3U> *v_00;
  Vector3d fjj;
  Vector3d fii;
  Vector3d radcomj;
  Vector3d radcomi;
  Vector3d tj;
  Vector3d ti;
  RealType wj2;
  RealType wi2;
  RealType frac2;
  RealType frac1;
  Vector3d dwjpdu;
  Vector3d dwipdu;
  Vector3d dwjdu;
  Vector3d dwidu;
  Vector3d dwjp;
  Vector3d dwip;
  RealType uglyj;
  RealType uglyi;
  Vector3d dwj;
  Vector3d dwi;
  RealType wp;
  RealType wjp;
  RealType wip;
  RealType zjs;
  RealType zjf;
  RealType zis;
  RealType zif;
  RealType w;
  RealType wj;
  RealType wi;
  RealType dspdr;
  RealType sp;
  RealType dsdr;
  RealType s;
  RealType zj2;
  RealType yj2;
  RealType xj2;
  RealType zi2;
  RealType yi2;
  RealType xi2;
  RealType zj;
  RealType yj;
  RealType xj;
  RealType zi;
  RealType yi;
  RealType xi;
  Vector3d rj;
  Vector3d ri;
  RotMat3x3d A2trans;
  RotMat3x3d A1trans;
  RealType r5;
  RealType r3;
  bool isPower;
  RealType rbig;
  RealType rup;
  RealType rlp;
  RealType ru;
  RealType rl;
  RealType v0p;
  RealType v0;
  RealType w0;
  StickyInteractionData *mixer;
  Vector<double,_3U> *in_stack_fffffffffffff7f8;
  Vector<double,_3U> *in_stack_fffffffffffff800;
  Vector<double,_3U> *in_stack_fffffffffffff808;
  Vector3<double> *in_stack_fffffffffffff810;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffff818;
  Vector<double,_3U> *in_stack_fffffffffffff820;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffff828;
  RectMatrix<double,_3U,_3U> *m;
  Sticky *in_stack_fffffffffffff830;
  RealType *in_stack_fffffffffffff880;
  RealType *in_stack_fffffffffffff888;
  CubicSpline *in_stack_fffffffffffff890;
  double local_288;
  double local_250;
  double local_230;
  double local_220;
  RectMatrix<double,_3U,_3U> local_1b8;
  Vector3<double> local_158 [2];
  Vector3<double> local_128 [7];
  double local_70;
  double local_68;
  byte local_59;
  double local_58;
  RealType local_50;
  RealType local_48;
  RealType local_40;
  RealType local_38;
  RealType local_30;
  RealType local_28;
  RealType local_20;
  reference local_18;
  int *local_10;
  
  local_10 = in_RSI;
  if (((ulong)in_RDI[1] & 1) == 0) {
    initialize(in_stack_fffffffffffff830);
  }
  this_00 = (vector<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
             *)(in_RDI + 0xb);
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)*local_10);
  this_01 = std::
            vector<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>,_std::allocator<std::vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>_>_>
            ::operator[](this_00,(long)*pvVar1);
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_10[1]);
  local_18 = std::
             vector<OpenMD::StickyInteractionData,_std::allocator<OpenMD::StickyInteractionData>_>::
             operator[](this_01,(long)*pvVar1);
  local_20 = local_18->w0;
  local_28 = local_18->v0;
  local_30 = local_18->v0p;
  local_38 = local_18->rl;
  local_40 = local_18->ru;
  local_48 = local_18->rlp;
  local_50 = local_18->rup;
  local_58 = local_18->rbig;
  local_59 = local_18->isPower & 1;
  if (*(double *)(local_10 + 8) <= local_58) {
    local_68 = *(double *)(local_10 + 10) * *(double *)(local_10 + 8);
    local_70 = local_68 * *(double *)(local_10 + 10);
    SquareMatrix3<double>::transpose((SquareMatrix3<double> *)in_stack_fffffffffffff828);
    SquareMatrix3<double>::transpose((SquareMatrix3<double> *)in_stack_fffffffffffff828);
    OpenMD::operator*(in_stack_fffffffffffff828,in_stack_fffffffffffff820);
    Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8)
    ;
    OpenMD::operator-(in_stack_fffffffffffff818);
    OpenMD::operator*(in_stack_fffffffffffff828,in_stack_fffffffffffff820);
    Vector3<double>::Vector3((Vector3<double> *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8)
    ;
    RectMatrix<double,_3U,_3U>::~RectMatrix(&local_1b8);
    pdVar2 = Vector3<double>::x(local_128);
    dVar3 = *pdVar2;
    pdVar2 = Vector3<double>::y(local_128);
    dVar4 = *pdVar2;
    pdVar2 = Vector3<double>::z(local_128);
    dVar6 = *pdVar2;
    pdVar2 = Vector3<double>::x(local_158);
    dVar5 = *pdVar2;
    pdVar2 = Vector3<double>::y(local_158);
    dVar7 = *pdVar2;
    pdVar2 = Vector3<double>::z(local_158);
    dVar8 = *pdVar2;
    local_220 = 0.0;
    local_230 = 0.0;
    if (*(double *)(local_10 + 8) < local_40) {
      if (local_38 <= *(double *)(local_10 + 8)) {
        CubicSpline::getValueAndDerivativeAt
                  (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880,
                   in_RDI);
      }
      else {
        local_220 = 1.0;
      }
    }
    if (*(double *)(local_10 + 8) < local_50) {
      if (local_48 <= *(double *)(local_10 + 8)) {
        CubicSpline::getValueAndDerivativeAt
                  (in_stack_fffffffffffff890,in_stack_fffffffffffff888,in_stack_fffffffffffff880,
                   in_RDI);
      }
      else {
        local_230 = 1.0;
      }
    }
    dVar3 = dVar3 * dVar3 - dVar4 * dVar4;
    dVar3 = ((dVar3 + dVar3) * dVar6) / local_68;
    dVar4 = dVar5 * dVar5 - dVar7 * dVar7;
    dVar4 = ((dVar4 + dVar4) * dVar8) / local_68;
    local_250 = dVar3 + dVar4;
    dVar5 = dVar6 / *(double *)(local_10 + 8) - 0.6;
    dVar6 = dVar6 / *(double *)(local_10 + 8) + 0.8;
    dVar7 = dVar8 / *(double *)(local_10 + 8) - 0.6;
    dVar8 = dVar8 / *(double *)(local_10 + 8) + 0.8;
    local_288 = (dVar5 * dVar5 * dVar6 * dVar6 - local_20) +
                (dVar7 * dVar7 * dVar8 * dVar8 - local_20);
    Vector3<double>::Vector3
              (in_stack_fffffffffffff810,(double)in_stack_fffffffffffff808,
               (double)in_stack_fffffffffffff800,(double)in_stack_fffffffffffff7f8);
    Vector3<double>::Vector3
              (in_stack_fffffffffffff810,(double)in_stack_fffffffffffff808,
               (double)in_stack_fffffffffffff800,(double)in_stack_fffffffffffff7f8);
    Vector3<double>::Vector3
              (in_stack_fffffffffffff810,(double)in_stack_fffffffffffff808,
               (double)in_stack_fffffffffffff800,(double)in_stack_fffffffffffff7f8);
    Vector3<double>::Vector3
              (in_stack_fffffffffffff810,(double)in_stack_fffffffffffff808,
               (double)in_stack_fffffffffffff800,(double)in_stack_fffffffffffff7f8);
    Vector3<double>::Vector3
              (in_stack_fffffffffffff810,(double)in_stack_fffffffffffff808,
               (double)in_stack_fffffffffffff800,(double)in_stack_fffffffffffff7f8);
    Vector3<double>::Vector3
              (in_stack_fffffffffffff810,(double)in_stack_fffffffffffff808,
               (double)in_stack_fffffffffffff800,(double)in_stack_fffffffffffff7f8);
    Vector3<double>::Vector3
              (in_stack_fffffffffffff810,(double)in_stack_fffffffffffff808,
               (double)in_stack_fffffffffffff800,(double)in_stack_fffffffffffff7f8);
    Vector3<double>::Vector3
              (in_stack_fffffffffffff810,(double)in_stack_fffffffffffff808,
               (double)in_stack_fffffffffffff800,(double)in_stack_fffffffffffff7f8);
    if ((local_59 & 1) != 0) {
      std::operator<<((ostream *)&std::cerr,"This is probably an error!\n");
      local_250 = dVar4 * 0.75 +
                  dVar4 * 0.25 * dVar4 * dVar4 + dVar3 * 0.25 * dVar3 * dVar3 + dVar3 * 0.75 +
                  local_30;
      local_288 = 0.0;
      OpenMD::operator*((double)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
      OpenMD::operator*((double)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
      OpenMD::operator+(in_stack_fffffffffffff808,in_stack_fffffffffffff800);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
      OpenMD::operator*((double)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
      OpenMD::operator*((double)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
      OpenMD::operator+(in_stack_fffffffffffff808,in_stack_fffffffffffff800);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffff800,
                 (Vector3<double> *)in_stack_fffffffffffff7f8);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffff800,
                 (Vector3<double> *)in_stack_fffffffffffff7f8);
      OpenMD::operator*((double)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
      OpenMD::operator*((double)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
      OpenMD::operator+(in_stack_fffffffffffff808,in_stack_fffffffffffff800);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
      OpenMD::operator*((double)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
      OpenMD::operator*((double)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
      OpenMD::operator+(in_stack_fffffffffffff808,in_stack_fffffffffffff800);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffff808,in_stack_fffffffffffff800);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffff800,
                 (Vector3<double> *)in_stack_fffffffffffff7f8);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffff800,
                 (Vector3<double> *)in_stack_fffffffffffff7f8);
      local_230 = 0.0;
    }
    *(double *)(local_10 + 0x34) =
         (local_28 * local_220 * local_250 + local_30 * local_230 * local_288) * 0.5 +
         *(double *)(local_10 + 0x34);
    v = (Vector<double,_3U> *)
        ((local_28 * local_220 * local_250 + local_30 * local_230 * local_288) * 0.5);
    m = *(RectMatrix<double,_3U,_3U> **)(local_10 + 0x10);
    pdVar2 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(local_10 + 0x18),5);
    *pdVar2 = (double)v * (double)m + *pdVar2;
    if ((*(byte *)((long)local_10 + 0xdb) & 1) != 0) {
      in_stack_fffffffffffff808 =
           (Vector<double,_3U> *)
           ((local_28 * local_220 * local_250 + local_30 * local_230 * local_288) * 0.5);
      dVar3 = *(double *)(local_10 + 0x10);
      pdVar2 = Vector<double,_7U>::operator[]((Vector<double,_7U> *)(local_10 + 0x38),5);
      *pdVar2 = (double)in_stack_fffffffffffff808 * dVar3 + *pdVar2;
    }
    v1 = (Vector<double,_3U> *)(*(double *)(local_10 + 0x10) * 0.5);
    OpenMD::operator*((double)in_stack_fffffffffffff808,v1);
    OpenMD::operator*((double)in_stack_fffffffffffff808,v1);
    OpenMD::operator+(in_stack_fffffffffffff808,v1);
    OpenMD::operator*((double)in_stack_fffffffffffff808,v1);
    Vector3<double>::Vector3((Vector3<double> *)v1,in_stack_fffffffffffff7f8);
    v_00 = (Vector<double,_3U> *)(*(double *)(local_10 + 0x10) * 0.5);
    OpenMD::operator*((double)in_stack_fffffffffffff808,v1);
    OpenMD::operator*((double)in_stack_fffffffffffff808,v1);
    OpenMD::operator+(in_stack_fffffffffffff808,v1);
    OpenMD::operator*((double)in_stack_fffffffffffff808,v1);
    Vector3<double>::Vector3((Vector3<double> *)v1,v_00);
    OpenMD::operator*(m,v);
    Vector<double,_3U>::operator+=(v1,v_00);
    OpenMD::operator*(m,v);
    Vector<double,_3U>::operator+=(v1,v_00);
    OpenMD::operator*((double)in_stack_fffffffffffff808,v1);
    OpenMD::operator*((double)in_stack_fffffffffffff808,v1);
    OpenMD::operator+(in_stack_fffffffffffff808,v1);
    OpenMD::operator*(in_stack_fffffffffffff808,(double)v1);
    Vector3<double>::Vector3((Vector3<double> *)v1,v_00);
    OpenMD::operator*((double)in_stack_fffffffffffff808,v1);
    OpenMD::operator*((double)in_stack_fffffffffffff808,v1);
    OpenMD::operator+(in_stack_fffffffffffff808,v1);
    OpenMD::operator*(in_stack_fffffffffffff808,(double)v1);
    Vector3<double>::Vector3((Vector3<double> *)v1,v_00);
    OpenMD::operator*(m,v);
    Vector3<double>::Vector3((Vector3<double> *)v1,v_00);
    OpenMD::operator*(m,v);
    Vector3<double>::Vector3((Vector3<double> *)v1,v_00);
    OpenMD::operator*((double)in_stack_fffffffffffff808,v1);
    operator/(in_stack_fffffffffffff808,(double)v1);
    OpenMD::operator+(in_stack_fffffffffffff808,v1);
    OpenMD::operator-(in_stack_fffffffffffff808,v1);
    OpenMD::operator*((double)in_stack_fffffffffffff808,v1);
    Vector<double,_3U>::operator+=(v1,v_00);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2b8f8f);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2b8f9c);
  }
  return;
}

Assistant:

void Sticky::calcForce(InteractionData& idat) {
    if (!initialized_) initialize();

    StickyInteractionData& mixer =
        MixingMap[Stids[idat.atid1]][Stids[idat.atid2]];

    RealType w0   = mixer.w0;
    RealType v0   = mixer.v0;
    RealType v0p  = mixer.v0p;
    RealType rl   = mixer.rl;
    RealType ru   = mixer.ru;
    RealType rlp  = mixer.rlp;
    RealType rup  = mixer.rup;
    RealType rbig = mixer.rbig;
    bool isPower  = mixer.isPower;

    if (idat.rij <= rbig) {
      RealType r3 = idat.r2 * idat.rij;
      RealType r5 = r3 * idat.r2;

      RotMat3x3d A1trans = idat.A1.transpose();
      RotMat3x3d A2trans = idat.A2.transpose();

      // rotate the inter-particle separation into the two different
      // body-fixed coordinate systems:

      Vector3d ri = idat.A1 * idat.d;

      // negative sign because this is the vector from j to i:

      Vector3d rj = -idat.A2 * idat.d;

      RealType xi = ri.x();
      RealType yi = ri.y();
      RealType zi = ri.z();

      RealType xj = rj.x();
      RealType yj = rj.y();
      RealType zj = rj.z();

      RealType xi2 = xi * xi;
      RealType yi2 = yi * yi;
      RealType zi2 = zi * zi;

      RealType xj2 = xj * xj;
      RealType yj2 = yj * yj;
      RealType zj2 = zj * zj;

      // calculate the switching info. from the splines

      RealType s     = 0.0;
      RealType dsdr  = 0.0;
      RealType sp    = 0.0;
      RealType dspdr = 0.0;

      if (idat.rij < ru) {
        if (idat.rij < rl) {
          s    = 1.0;
          dsdr = 0.0;
        } else {
          // we are in the switching region
          mixer.s->getValueAndDerivativeAt(idat.rij, s, dsdr);
        }
      }

      if (idat.rij < rup) {
        if (idat.rij < rlp) {
          sp    = 1.0;
          dspdr = 0.0;
        } else {
          // we are in the switching region
          mixer.sp->getValueAndDerivativeAt(idat.rij, sp, dspdr);
        }
      }

      RealType wi = 2.0 * (xi2 - yi2) * zi / r3;
      RealType wj = 2.0 * (xj2 - yj2) * zj / r3;
      RealType w  = wi + wj;

      RealType zif = zi / idat.rij - 0.6;
      RealType zis = zi / idat.rij + 0.8;

      RealType zjf = zj / idat.rij - 0.6;
      RealType zjs = zj / idat.rij + 0.8;

      RealType wip = zif * zif * zis * zis - w0;
      RealType wjp = zjf * zjf * zjs * zjs - w0;
      RealType wp  = wip + wjp;

      Vector3d dwi(4.0 * xi * zi / r3 - 6.0 * xi * zi * (xi2 - yi2) / r5,
                   -4.0 * yi * zi / r3 - 6.0 * yi * zi * (xi2 - yi2) / r5,
                   2.0 * (xi2 - yi2) / r3 - 6.0 * zi2 * (xi2 - yi2) / r5);

      Vector3d dwj(4.0 * xj * zj / r3 - 6.0 * xj * zj * (xj2 - yj2) / r5,
                   -4.0 * yj * zj / r3 - 6.0 * yj * zj * (xj2 - yj2) / r5,
                   2.0 * (xj2 - yj2) / r3 - 6.0 * zj2 * (xj2 - yj2) / r5);

      RealType uglyi = zif * zif * zis + zif * zis * zis;
      RealType uglyj = zjf * zjf * zjs + zjf * zjs * zjs;

      Vector3d dwip(-2.0 * xi * zi * uglyi / r3, -2.0 * yi * zi * uglyi / r3,
                    2.0 * (1.0 / idat.rij - zi2 / r3) * uglyi);

      Vector3d dwjp(-2.0 * xj * zj * uglyj / r3, -2.0 * yj * zj * uglyj / r3,
                    2.0 * (1.0 / idat.rij - zj2 / r3) * uglyj);

      Vector3d dwidu(4.0 * (yi * zi2 + 0.5 * yi * (xi2 - yi2)) / r3,
                     4.0 * (xi * zi2 - 0.5 * xi * (xi2 - yi2)) / r3,
                     -8.0 * xi * yi * zi / r3);

      Vector3d dwjdu(4.0 * (yj * zj2 + 0.5 * yj * (xj2 - yj2)) / r3,
                     4.0 * (xj * zj2 - 0.5 * xj * (xj2 - yj2)) / r3,
                     -8.0 * xj * yj * zj / r3);

      Vector3d dwipdu(2.0 * yi * uglyi / idat.rij, -2.0 * xi * uglyi / idat.rij,
                      0.0);

      Vector3d dwjpdu(2.0 * yj * uglyj / idat.rij, -2.0 * xj * uglyj / idat.rij,
                      0.0);

      if (isPower) {
        cerr << "This is probably an error!\n";
        RealType frac1 = 0.25;
        RealType frac2 = 0.75;
        RealType wi2   = wi * wi;
        RealType wj2   = wj * wj;
        // sticky power has no w' function:
        w = frac1 * wi * wi2 + frac2 * wi + frac1 * wj * wj2 + frac2 * wj + v0p;
        wp     = 0.0;
        dwi    = frac1 * RealType(3.0) * wi2 * dwi + frac2 * dwi;
        dwj    = frac1 * RealType(3.0) * wj2 * dwi + frac2 * dwi;
        dwip   = V3Zero;
        dwjp   = V3Zero;
        dwidu  = frac1 * RealType(3.0) * wi2 * dwidu + frac2 * dwidu;
        dwidu  = frac1 * RealType(3.0) * wj2 * dwjdu + frac2 * dwjdu;
        dwipdu = V3Zero;
        dwjpdu = V3Zero;
        sp     = 0.0;
        dspdr  = 0.0;
      }

      idat.vpair += 0.5 * (v0 * s * w + v0p * sp * wp);
      idat.pot[HYDROGENBONDING_FAMILY] +=
          0.5 * (v0 * s * w + v0p * sp * wp) * idat.sw;
      if (idat.isSelected)
        idat.selePot[HYDROGENBONDING_FAMILY] +=
            0.5 * (v0 * s * w + v0p * sp * wp) * idat.sw;

      // do the torques first since they are easy:
      // remember that these are still in the body-fixed axes

      Vector3d ti = 0.5 * idat.sw * (v0 * s * dwidu + v0p * sp * dwipdu);
      Vector3d tj = 0.5 * idat.sw * (v0 * s * dwjdu + v0p * sp * dwjpdu);

      // go back to lab frame using transpose of rotation matrix:

      idat.t1 += A1trans * ti;
      idat.t2 += A2trans * tj;

      // Now, on to the forces:

      // first rotate the i terms back into the lab frame:

      Vector3d radcomi = (v0 * s * dwi + v0p * sp * dwip) * idat.sw;
      Vector3d radcomj = (v0 * s * dwj + v0p * sp * dwjp) * idat.sw;

      Vector3d fii = A1trans * radcomi;
      Vector3d fjj = A2trans * radcomj;

      // now assemble these with the radial-only terms:

      idat.f1 += 0.5 * ((v0 * dsdr * w + v0p * dspdr * wp) * idat.d / idat.rij +
                        fii - fjj);
    }

    return;
  }